

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADABUMathQuaternion.cpp
# Opt level: O2

Quaternion *
COLLADABU::Math::Quaternion::nlerp
          (Quaternion *__return_storage_ptr__,Real fT,Quaternion *rkP,Quaternion *rkQ,
          bool shortestPath)

{
  Real RVar1;
  Real RVar2;
  Real RVar3;
  Real RVar4;
  double local_48;
  double dStack_40;
  double local_38;
  double dStack_30;
  
  RVar1 = dot(rkP,rkQ);
  if (0.0 <= RVar1 || !shortestPath) {
    operator-(rkQ,rkP);
    RVar1 = rkP->w + local_48 * fT;
    RVar2 = rkP->x + dStack_40 * fT;
    RVar3 = fT * local_38 + rkP->y;
    RVar4 = fT * dStack_30 + rkP->z;
  }
  else {
    RVar1 = (-rkQ->w - rkP->w) * fT + rkP->w;
    RVar2 = (-rkQ->x - rkP->x) * fT + rkP->x;
    RVar3 = (-rkQ->y - rkP->y) * fT + rkP->y;
    RVar4 = (-rkQ->z - rkP->z) * fT + rkP->z;
  }
  __return_storage_ptr__->w = RVar1;
  __return_storage_ptr__->x = RVar2;
  __return_storage_ptr__->y = RVar3;
  __return_storage_ptr__->z = RVar4;
  normalise(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Quaternion Quaternion::nlerp( Real fT, const Quaternion& rkP,
                                      const Quaternion& rkQ, bool shortestPath )
        {
            Quaternion result;
            Real fCos = rkP.dot( rkQ );

            if ( fCos < 0.0f && shortestPath )
            {
                result = rkP + fT * ( ( -rkQ ) - rkP );
            }

            else
            {
                result = rkP + fT * ( rkQ - rkP );
            }

            result.normalise();
            return result;
        }